

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O2

bool deqp::gls::BuiltinPrecisionTests::
     ContainerTraits<tcu::Matrix<float,_4,_2>,_tcu::Matrix<tcu::Interval,_4,_2>_>::doContains
               (IVal *ival,Matrix<float,_4,_2> *value)

{
  ulong uVar1;
  bool bVar2;
  ulong uVar3;
  
  uVar1 = 0;
  do {
    uVar3 = uVar1;
    if (uVar3 == 2) break;
    bVar2 = ContainerTraits<tcu::Vector<float,_4>,_tcu::Vector<tcu::Interval,_4>_>::doContains
                      ((IVal *)ival,(Vector<float,_4> *)value);
    value = (Matrix<float,_4,_2> *)((long)value + 0x10);
    ival = (IVal *)((long)ival + 0x60);
    uVar1 = uVar3 + 1;
  } while (bVar2);
  return 1 < uVar3;
}

Assistant:

static bool			doContains		(const IVal& ival, const T& value)
	{
		for (int ndx = 0; ndx < T::SIZE; ++ndx)
			if (!contains(ival[ndx], value[ndx]))
				return false;

		return true;
	}